

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase330::run(TestCase330 *this)

{
  TaskSet **this_00;
  int iVar1;
  void *pvVar2;
  undefined1 local_2b8 [8];
  Promise<void> promise2;
  Promise<void> promise1;
  Fault f_3;
  SyscallResult local_284;
  undefined1 local_280 [4];
  SyscallResult _kjSyscallResult_3;
  FdObserver observer2;
  undefined1 local_220 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:346:3)>
  _kjDefer346;
  Fault f_2;
  SyscallResult local_1fc;
  undefined1 local_1f8 [4];
  SyscallResult _kjSyscallResult_2;
  int pipefds2 [2];
  Fault f_1;
  SyscallResult local_1dc;
  undefined1 local_1d8 [4];
  SyscallResult _kjSyscallResult_1;
  FdObserver observer;
  undefined1 local_178 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:338:3)>
  _kjDefer338;
  Fault f;
  SyscallResult local_154;
  undefined1 local_150 [4];
  SyscallResult _kjSyscallResult;
  int pipefds [2];
  WaitScope waitScope;
  undefined1 local_128 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase330 *this_local;
  
  captureSignals();
  this_00 = &loop.daemons.ptr;
  UnixEventPort::UnixEventPort((UnixEventPort *)this_00);
  EventLoop::EventLoop((EventLoop *)local_128,(EventPort *)this_00);
  WaitScope::WaitScope((WaitScope *)pipefds,(EventLoop *)local_128);
  f.exception = (Exception *)local_150;
  local_154 = _::Debug::syscall<kj::(anonymous_namespace)::TestCase330::run()::__0>
                        ((anon_class_8_1_619ab5e7 *)&f,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_154);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_154);
    _::Debug::Fault::Fault
              ((Fault *)&_kjDefer338.canceled,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x151,iVar1,"pipe(pipefds)","");
    _::Debug::Fault::fatal((Fault *)&_kjDefer338.canceled);
  }
  observer._80_8_ = local_150;
  defer<kj::(anonymous_namespace)::TestCase330::run()::__1>((kj *)local_178,(Type *)&observer.atEnd)
  ;
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)local_1d8,(UnixEventPort *)&loop.daemons.ptr,(int)local_150,1);
  f_1.exception = (Exception *)local_150;
  local_1dc = _::Debug::syscall<kj::(anonymous_namespace)::TestCase330::run()::__2>
                        ((anon_class_8_1_619ab5e7 *)&f_1,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1dc);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_1dc);
    _::Debug::Fault::Fault
              ((Fault *)pipefds2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x156,iVar1,"write(pipefds[1], \"foo\", 3)","");
    _::Debug::Fault::fatal((Fault *)pipefds2);
  }
  f_2.exception = (Exception *)local_1f8;
  local_1fc = _::Debug::syscall<kj::(anonymous_namespace)::TestCase330::run()::__3>
                        ((anon_class_8_1_d1bc0389 *)&f_2,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1fc);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_1fc);
    _::Debug::Fault::Fault
              ((Fault *)&_kjDefer346.canceled,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x159,iVar1,"pipe(pipefds2)","");
    _::Debug::Fault::fatal((Fault *)&_kjDefer346.canceled);
  }
  observer2._80_8_ = local_1f8;
  defer<kj::(anonymous_namespace)::TestCase330::run()::__4>
            ((kj *)local_220,(Type *)&observer2.atEnd);
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)local_280,(UnixEventPort *)&loop.daemons.ptr,(int)local_1f8,1);
  f_3.exception = (Exception *)local_1f8;
  local_284 = _::Debug::syscall<kj::(anonymous_namespace)::TestCase330::run()::__5>
                        ((anon_class_8_1_d1bc0389 *)&f_3,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_284);
  if (pvVar2 != (void *)0x0) {
    UnixEventPort::FdObserver::whenBecomesReadable
              ((FdObserver *)&promise2.super_PromiseBase.node.ptr);
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_2b8);
    Promise<void>::wait((Promise<void> *)&promise2.super_PromiseBase.node.ptr,pipefds);
    Promise<void>::wait((Promise<void> *)local_2b8,pipefds);
    Promise<void>::~Promise((Promise<void> *)local_2b8);
    Promise<void>::~Promise((Promise<void> *)&promise2.super_PromiseBase.node.ptr);
    UnixEventPort::FdObserver::~FdObserver((FdObserver *)local_280);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:346:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:346:3)>
                 *)local_220);
    UnixEventPort::FdObserver::~FdObserver((FdObserver *)local_1d8);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:338:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:338:3)>
                 *)local_178);
    WaitScope::~WaitScope((WaitScope *)pipefds);
    EventLoop::~EventLoop((EventLoop *)local_128);
    UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.daemons.ptr);
    return;
  }
  iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_284);
  _::Debug::Fault::Fault
            ((Fault *)&promise1.super_PromiseBase.node.ptr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,0x15e,iVar1,"write(pipefds2[1], \"bar\", 3)","");
  _::Debug::Fault::fatal((Fault *)&promise1.super_PromiseBase.node.ptr);
}

Assistant:

TEST(AsyncUnixTest, ReadObserverMultiReceive) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  KJ_DEFER({ close(pipefds[1]); close(pipefds[0]); });

  UnixEventPort::FdObserver observer(port, pipefds[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds[1], "foo", 3));

  int pipefds2[2];
  KJ_SYSCALL(pipe(pipefds2));
  KJ_DEFER({ close(pipefds2[1]); close(pipefds2[0]); });

  UnixEventPort::FdObserver observer2(port, pipefds2[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds2[1], "bar", 3));

  auto promise1 = observer.whenBecomesReadable();
  auto promise2 = observer2.whenBecomesReadable();
  promise1.wait(waitScope);
  promise2.wait(waitScope);
}